

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3NestedParse(Parse *pParse,char *zFormat,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined1 local_f8 [8];
  char saveBuf [164];
  sqlite3 *db;
  char *zErrMsg;
  char *zSql;
  va_list ap;
  char *zFormat_local;
  Parse *pParse_local;
  
  if (in_AL != '\0') {
    local_178 = in_XMM0_Qa;
    local_168 = in_XMM1_Qa;
    local_158 = in_XMM2_Qa;
    local_148 = in_XMM3_Qa;
    local_138 = in_XMM4_Qa;
    local_128 = in_XMM5_Qa;
    local_118 = in_XMM6_Qa;
    local_108 = in_XMM7_Qa;
  }
  db = (sqlite3 *)0x0;
  unique0x00012000 = pParse->db;
  if (pParse->nErr == 0) {
    ap[0].overflow_arg_area = local_1a8;
    ap[0]._0_8_ = &stack0x00000008;
    zSql._4_4_ = 0x30;
    zSql._0_4_ = 0x10;
    local_198 = in_RDX;
    local_190 = in_RCX;
    local_188 = in_R8;
    local_180 = in_R9;
    zErrMsg = sqlite3VMPrintf(unique0x00012000,zFormat,(__va_list_tag *)&zSql);
    if (zErrMsg != (char *)0x0) {
      pParse->nested = pParse->nested + '\x01';
      memcpy(local_f8,&pParse->nVar,0xa4);
      memset(&pParse->nVar,0,0xa4);
      sqlite3RunParser(pParse,zErrMsg,(char **)&db);
      sqlite3DbFree(stack0xffffffffffffffb0,db);
      sqlite3DbFree(stack0xffffffffffffffb0,zErrMsg);
      memcpy(&pParse->nVar,local_f8,0xa4);
      pParse->nested = pParse->nested + 0xff;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3NestedParse(Parse *pParse, const char *zFormat, ...){
  va_list ap;
  char *zSql;
  char *zErrMsg = 0;
  sqlite3 *db = pParse->db;
# define SAVE_SZ  (sizeof(Parse) - offsetof(Parse,nVar))
  char saveBuf[SAVE_SZ];

  if( pParse->nErr ) return;
  assert( pParse->nested<10 );  /* Nesting should only be of limited depth */
  va_start(ap, zFormat);
  zSql = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    return;   /* A malloc must have failed */
  }
  pParse->nested++;
  memcpy(saveBuf, &pParse->nVar, SAVE_SZ);
  memset(&pParse->nVar, 0, SAVE_SZ);
  sqlite3RunParser(pParse, zSql, &zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  sqlite3DbFree(db, zSql);
  memcpy(&pParse->nVar, saveBuf, SAVE_SZ);
  pParse->nested--;
}